

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToFirst(DBIter *this)

{
  uint uVar1;
  DBIter *this_local;
  
  this->direction_ = kForward;
  ClearSavedValue(this);
  (*this->iter_->_vptr_Iterator[3])();
  uVar1 = (*this->iter_->_vptr_Iterator[2])();
  if ((uVar1 & 1) == 0) {
    this->valid_ = false;
  }
  else {
    FindNextUserEntry(this,false,&this->saved_key_);
  }
  return;
}

Assistant:

void DBIter::SeekToFirst() {
            direction_ = kForward;
            ClearSavedValue();
            iter_->SeekToFirst();
            if (iter_->Valid()) {
                FindNextUserEntry(false, &saved_key_ /* temporary storage */);
            } else {
                valid_ = false;
            }
        }